

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O3

void __thiscall
draco::Encoder::SetAttributeExplicitQuantization
          (Encoder *this,Type type,int quantization_bits,int num_dims,float *origin,float range)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Options *pOVar2;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *this_00;
  Type local_54;
  string local_50;
  float local_2c;
  
  paVar1 = &local_50.field_2;
  local_54 = type;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  local_2c = range;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quantization_bits","");
  this_00 = &(this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
             options_;
  pOVar2 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                     (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_54);
  Options::SetInt(pOVar2,&local_50,quantization_bits);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quantization_origin","");
  pOVar2 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                     (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_54);
  Options::SetVector<float>(pOVar2,&local_50,origin,num_dims);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quantization_range","");
  pOVar2 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                     (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_54);
  Options::SetFloat(pOVar2,&local_50,local_2c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Encoder::SetAttributeExplicitQuantization(GeometryAttribute::Type type,
                                               int quantization_bits,
                                               int num_dims,
                                               const float *origin,
                                               float range) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
  options().SetAttributeVector(type, "quantization_origin", num_dims, origin);
  options().SetAttributeFloat(type, "quantization_range", range);
}